

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int os_tmpname(lua_State *L)

{
  char *pcVar1;
  char local_38 [4];
  int err;
  char buff [20];
  lua_State *L_local;
  
  pcVar1 = tmpnam(local_38);
  if (pcVar1 == (char *)0x0) {
    L_local._4_4_ = luaL_error(L,"unable to generate a unique filename");
  }
  else {
    lua_pushstring(L,local_38);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int os_tmpname (lua_State *L) {
  char buff[LUA_TMPNAMBUFSIZE];
  int err;
  lua_tmpnam(buff, err);
  if (err)
    return luaL_error(L, "unable to generate a unique filename");
  lua_pushstring(L, buff);
  return 1;
}